

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O2

LTFlightData * __thiscall ACTable::build(ACTable *this,string *_filter,int _x,int _y)

{
  undefined1 uVar1;
  FDInfo *pFVar2;
  bool bVar3;
  ImU32 col_00;
  ImU32 col_01;
  ImGuiTableSortSpecs *pIVar4;
  LTFlightData *pLVar5;
  ACIWnd *pAVar6;
  ImGuiContext *ctx;
  ImGuiTableSortSpecsColumn *pIVar7;
  FDInfo *this_00;
  string *psVar8;
  ImGuiTableColumnFlags *pIVar9;
  AlignTy *pAVar10;
  string *psVar11;
  ImGuiID col;
  long lVar12;
  ImVec2 IVar13;
  allocator<char> local_9b;
  bool bAutoVisible;
  allocator<char> local_99;
  ImVec2 tblSize;
  ImVec2 selSize;
  LTAircraft *local_88;
  string url;
  string local_50;
  
  IVar13 = ImGui::GetContentRegionAvail();
  tblSize.x = (float)_x;
  if (_x < 1) {
    tblSize.x = tblSize.x + IVar13.x;
  }
  tblSize.y = (float)_y;
  if (_y < 1) {
    tblSize.y = IVar13.y + tblSize.y;
  }
  bVar3 = ImGui::BeginTable("ACList",0x27,0x170804f,&tblSize,0.0);
  if (!bVar3) {
    return (LTFlightData *)0x0;
  }
  pIVar9 = &gCols._M_elems[0].colFlags;
  for (lVar12 = 0; lVar12 != 0x27; lVar12 = lVar12 + 1) {
    ImGui::TableSetupColumn
              ((((ACTColDefTy *)(pIVar9 + -10))->colName)._M_dataplus._M_p,*pIVar9 | 0x800,
               (float)pIVar9[-2],(ImGuiID)lVar12);
    pIVar9 = pIVar9 + 0xc;
  }
  ImGui::TableAutoHeaders();
  bVar3 = UpdateFDIs(this,_filter);
  pIVar4 = ImGui::TableGetSortSpecs();
  if (bVar3) {
    pIVar7 = pIVar4->Specs;
  }
  else if ((((pIVar4 == (ImGuiTableSortSpecs *)0x0) || (pIVar4->SpecsChanged != true)) ||
           (pIVar7 = pIVar4->Specs, pIVar7 == (ImGuiTableSortSpecsColumn *)0x0)) ||
          ((pIVar4->SpecsCount < 1 ||
           ((ulong)(((long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x5b0) < 2)))) goto LAB_0011e031;
  Sort(this,*(ACTColumnsTy *)pIVar7,pIVar7[6] == (ImGuiTableSortSpecsColumn)0x1);
LAB_0011e031:
  this_00 = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar2 = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar8 = (this_00->v)._M_elems;
LAB_0011e042:
  if (this_00 == pFVar2) {
    ImGui::EndTable();
    return (LTFlightData *)0x0;
  }
  ImGui::TableNextRow(0,0.0);
  pAVar10 = &gCols._M_elems[0].colAlign;
  lVar12 = 0;
  psVar11 = psVar8;
  do {
    if ((lVar12 != 0xe) && (lVar12 != 0x26)) {
      if (lVar12 == 0x27) break;
      bVar3 = ImGui::TableSetColumnIndex((int)lVar12);
      if (bVar3) {
        ImGui::TextAligned(*pAVar10,psVar11);
      }
    }
    lVar12 = lVar12 + 1;
    pAVar10 = pAVar10 + 0xc;
    psVar11 = psVar11 + 1;
  } while( true );
  ImGui::PushID((this_00->key).key._M_dataplus._M_p);
  col_00 = ImGui::GetColorU32(0x18,1.0);
  col_01 = ImGui::GetColorU32(0x19,1.0);
  ImGui::PushStyleColor(0x18,col_01);
  ImGui::PushStyleColor(0x19,col_00);
  selSize.x = ImGui::GetWidthIconBtn(false);
  selSize.y = 0.0;
  pLVar5 = FDInfo::GetFD(this_00);
  if (pLVar5 == (LTFlightData *)0x0) {
    local_88 = (LTAircraft *)0x0;
  }
  else {
    local_88 = pLVar5->pAc;
  }
  psVar11 = &(this_00->key).key;
  bVar3 = ImGui::TableSetColumnIndex(0xe);
  if (bVar3) {
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_12c45,false,(this_00->key).eKeyType == KEY_ICAO,
                       "Update aircraft profile at OpenSky",0,&selSize);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&url,"https://opensky-network.org/aircraft-profile?icao24=",&local_9b);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar11);
      LTOpenURL(&url,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&url);
    }
    ImGui::SameLine(0.0,-1.0);
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_12c8d,false,(this_00->v)._M_elems[10]._M_string_length != 0,
                       "Update flight/route at OpenSky",0,&selSize);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&url,"https://opensky-network.org/add-route?callsign=",
                 (allocator<char> *)&local_50);
      LTOpenURL(&url,(this_00->v)._M_elems + 10);
      std::__cxx11::string::~string((string *)&url);
    }
  }
  bVar3 = ImGui::TableSetColumnIndex(0x26);
  if (bVar3) {
    local_9b = (allocator<char>)0x0;
    if (local_88 == (LTAircraft *)0x0) {
      bAutoVisible = false;
    }
    else {
      local_9b = (allocator<char>)0x0;
      if ((local_88->super_Aircraft).bVisible != false) {
        uVar1 = (local_88->super_Aircraft).bValid;
        local_9b = (allocator<char>)uVar1;
      }
      bAutoVisible = local_88->bAutoVisible;
    }
    pAVar6 = ACIWnd::GetWnd(&this_00->key);
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_12cd5,pAVar6 != (ACIWnd *)0x0,true,"Open Aircraft Info Window"
                       ,0,&selSize);
    if (bVar3) {
      ctx = ImGui::GetCurrentContext();
      if (pAVar6 == (ACIWnd *)0x0) {
        std::__cxx11::string::string((string *)&url,(string *)psVar11);
        ACIWnd::OpenNewWnd(&url,WND_MODE_FLOAT_CNT_VR);
        std::__cxx11::string::~string((string *)&url);
      }
      else {
        (*(pAVar6->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])(pAVar6);
      }
      ImGui::SetCurrentContext(ctx);
    }
    ImGui::SameLine(0.0,-1.0);
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_12d05,
                       LTAircraft::pExtViewAc == local_88 && local_88 != (LTAircraft *)0x0,
                       local_88 != (LTAircraft *)0x0,"Toggle camera view",0,&selSize);
    if (bVar3) {
      LTAircraft::ToggleCameraView(local_88);
    }
    ImGui::SameLine(0.0,-1.0);
    if (pLVar5 == (LTFlightData *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&url,"",(allocator<char> *)&local_50);
    }
    else {
      std::__cxx11::string::string((string *)&url,(string *)&(pLVar5->statData).slug);
    }
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_4f91,false,url._M_string_length != 0,"Open flight in browser",
                       0,&selSize);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_99);
      LTOpenURL(&url,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    ImGui::SameLine(0.0,-1.0);
    bVar3 = ImGui::SelectableTooltip
                      (anon_var_dwarf_12d71,(bool *)&local_9b,local_88 != (LTAircraft *)0x0,
                       "Toggle aircraft\'s visibility",0,&selSize);
    if (bVar3) {
      (*(local_88->super_Aircraft)._vptr_Aircraft[4])(local_88,(ulong)(byte)local_9b);
    }
    bVar3 = DataRefs::IsAutoHidingActive(&dataRefs);
    if (bVar3) {
      ImGui::SameLine(0.0,-1.0);
      bVar3 = ImGui::SelectableTooltip
                        (anon_var_dwarf_12d95,&bAutoVisible,local_88 != (LTAircraft *)0x0,
                         "Toggle aircraft\'s auto visibility",0,&selSize);
      if (bVar3) {
        LTAircraft::SetAutoVisible(local_88,bAutoVisible);
      }
    }
    std::__cxx11::string::~string((string *)&url);
  }
  ImGui::PopStyleColor(2);
  ImGui::PopID();
  this_00 = this_00 + 1;
  psVar8 = (string *)&psVar8[0x2d].field_2;
  goto LAB_0011e042;
}

Assistant:

LTFlightData* ACTable::build (const std::string& _filter, int _x, int _y)
{
    // return value: the just selected aircraft, if any
    LTFlightData* pSelFD = nullptr;
    
    // Determine size, basis is the available content region
    ImVec2 tblSize = ImGui::GetContentRegionAvail();
    if (_x <= 0) tblSize.x += float(_x);    // Determine width
    else tblSize.x = float(_x);
    if (_y <= 0) tblSize.y += float(_y);    // Determine height
    else tblSize.y = float(_y);
    
    // Start drawing the table
    if (ImGui::BeginTable("ACList", ACT_COL_COUNT,
                          ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable |
                          ImGuiTableFlags_Hideable | ImGuiTableFlags_Sortable |
                          ImGuiTableFlags_RowBg |
                          ImGuiTableFlags_SizingPolicyFixedX | ImGuiTableFlags_Scroll |
                          ImGuiTableFlags_ScrollFreezeTopRow |
                          ImGuiTableFlags_ScrollFreezeLeftColumn,
                          tblSize))
    {
        // Set up the columns
        for (ImGuiID col = 0; col < ACT_COL_COUNT; ++col) {
            const ACTColDefTy& colDef = gCols[col];
            ImGui::TableSetupColumn(colDef.colName.c_str(),
                                    colDef.colFlags | ImGuiTableColumnFlags_NoHeaderWidth,
                                    colDef.colWidth,
                                    col);       // use ACTColumnsTy as ColumnUserID
        }
        ImGui::TableAutoHeaders();

        // Set up a/c list
        bool bUpdated = UpdateFDIs(_filter);

        // Sort the data if and as needed
        const ImGuiTableSortSpecs* sortSpecs = ImGui::TableGetSortSpecs();
        if (bUpdated ||
            (sortSpecs && sortSpecs->SpecsChanged &&
             sortSpecs->Specs && sortSpecs->SpecsCount >= 1 &&
             vecFDI.size() > 1))
        {
            // We sort only by one column, no multi-column sort yet
            const ImGuiTableSortSpecsColumn& colSpec = *(sortSpecs->Specs);
            Sort((ACTColumnsTy)colSpec.ColumnUserID,
                 colSpec.SortDirection == ImGuiSortDirection_Ascending);
        }
        
        // Fill the data into the list
        for (const FDInfo& fdi: vecFDI) {
            ImGui::TableNextRow();
            for (size_t col = 0; col < ACT_COL_COUNT; ++col) {
                switch (col) {
                    // There are a few columns with special treatment,
                    case ACT_COL_UPDATE:
                    case ACT_COL_ACTIONS:
                        continue;
                     // the others are just to be drawn
                    default:
                        if (ImGui::TableSetColumnIndex(int(col))) {
                            ImGui::TextAligned(gCols[col].colAlign, fdi.v[col]);
                        }
                }
            }
            
            // --- prepare for columns with action buttons ---
            
            // Make sure all the buttons have a unique id
            ImGui::PushID(fdi.key.c_str());
            
            // Make selected buttons more visible: Exchange Hovered (lighter) and std color (darker)
            const ImU32 colHeader = ImGui::GetColorU32(ImGuiCol_Header);
            ImGui::PushStyleColor(ImGuiCol_Header,          ImGui::GetColorU32(ImGuiCol_HeaderHovered));
            ImGui::PushStyleColor(ImGuiCol_HeaderHovered,   colHeader);
            
            // Limit the width of the selectables
            ImVec2 selSize (ImGui::GetWidthIconBtn(), 0.0f);
            
            // (Potential) access to the aircraft, can be `nullptr`!
            LTFlightData* pFD = fdi.GetFD();
            LTAircraft* pAc = pFD ? pFD->GetAircraft() : nullptr;
            
            // Update columnd
            if (ImGui::TableSetColumnIndex(ACT_COL_UPDATE)) {
                // Aircraft Profile update (if there is an ICAO key)
                if (ImGui::SelectableTooltip(ICON_FA_PLANE "##AircraftProfile",
                                             false,                                         // selected?
                                             fdi.key.eKeyType == LTFlightData::KEY_ICAO,    // enabled?
                                             "Update aircraft profile at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_AC, fdi.key);
                
                // Route update (if there is a call sign)
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_ROUTE "##Route",
                                             false,                                         // selected?
                                             !fdi.v[ACT_COL_CALLSIGN].empty(),              // enabled?
                                             "Update flight/route at OpenSky",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(OPSKY_EDIT_ROUTE, fdi.v[ACT_COL_CALLSIGN]);
            }

            // Action column
            if (ImGui::TableSetColumnIndex(ACT_COL_ACTIONS)) {
                // Is a/c visible/auto-visible?
                bool bVisible       = pAc ? pAc->IsVisible()        : false;
                bool bAutoVisible   = pAc ? pAc->IsAutoVisible()    : false;

                // Open a/c info window
                ACIWnd* pACIWnd = ACIWnd::GetWnd(fdi.key);
                if (ImGui::SelectableTooltip(ICON_FA_INFO_CIRCLE "##ACIWnd",
                                             pACIWnd != nullptr, true,              // selected?, enabled!
                                             "Open Aircraft Info Window",
                                             ImGuiSelectableFlags_None, selSize))
                {
                    // Toggle a/c info wnd (safe/restore our context as we are now dealing with another ImGui window,
                    // which can mess up context pointers)
                    ImGuiContext* pCtxt = ImGui::GetCurrentContext();
                    if (pACIWnd) {
                        delete pACIWnd;
                        pACIWnd = nullptr;
                    } else {
                        ACIWnd::OpenNewWnd(fdi.key);
                    }
                    ImGui::SetCurrentContext(pCtxt);

                    // Open an ACIWnd, which is another ImGui window, so safe/restore our context
                }

                // Camera view
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_CAMERA "##CameraView",
                                             pAc ? pAc->IsInCameraView() : false,   // selected?
                                             pAc != nullptr,                        // enabled?
                                             "Toggle camera view",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->ToggleCameraView();

                // Link to browser for following the flight
                ImGui::SameLine();
                const std::string url (pFD ? pFD->GetUnsafeStat().slug : "");
                if (ImGui::SelectableTooltip(ICON_FA_EXTERNAL_LINK_SQUARE_ALT "##FlightURL",
                                             false,                                 // selected?
                                             !url.empty(),                          // enabled?
                                             "Open flight in browser",
                                             ImGuiSelectableFlags_None, selSize))
                    LTOpenURL(url);
                
                // Visible
                ImGui::SameLine();
                if (ImGui::SelectableTooltip(ICON_FA_EYE "##Visible", &bVisible,
                                             pAc != nullptr,      // enabled/disabled?
                                             "Toggle aircraft's visibility",
                                             ImGuiSelectableFlags_None, selSize))
                    pAc->SetVisible(bVisible);

                // "Auto Visible" only if some auto-hiding option is on
                if (dataRefs.IsAutoHidingActive()) {
                    ImGui::SameLine();
                    if (ImGui::SelectableTooltip(ICON_FA_EYE "##AutoVisible", &bAutoVisible,
                                                 pAc != nullptr,  // enabled/disabled
                                                 "Toggle aircraft's auto visibility",
                                                 ImGuiSelectableFlags_None, selSize))
                        pAc->SetAutoVisible(bAutoVisible);
                }
            } // action column

            // Restore styles
            ImGui::PopStyleColor(2);
            ImGui::PopID();

        }   // for all a/c rows
        
        // End of aircraft list
        ImGui::EndTable();
    }
    
    // return value: the just selected aircraft, if any
    return pSelFD;
}